

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int ptls_openssl_decrypt_ticket_evp
              (ptls_buffer_t *buf,ptls_iovec_t src,
              _func_int_uchar_ptr_uchar_ptr_EVP_CIPHER_CTX_ptr_EVP_MAC_CTX_ptr_int *cb)

{
  uint8_t *puVar1;
  ptls_buffer_t *ppVar2;
  int iVar3;
  int iVar4;
  EVP_CIPHER_CTX *ctx;
  long lVar5;
  EVP_MAC_CTX *pEVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  int clen;
  uint8_t *local_90;
  ptls_buffer_t *local_88;
  size_t hlen;
  uint8_t hmac [64];
  
  uVar8 = src.len;
  ctx = EVP_CIPHER_CTX_new();
  if (ctx == (EVP_CIPHER_CTX *)0x0) {
    return 0x201;
  }
  pEVar6 = (EVP_MAC_CTX *)0x0;
  local_90 = src.base;
  local_88 = buf;
  lVar5 = EVP_MAC_fetch(0,"HMAC",0);
  iVar4 = 0x201;
  if (lVar5 != 0) {
    pEVar6 = (EVP_MAC_CTX *)EVP_MAC_CTX_new(lVar5);
    if (pEVar6 == (EVP_MAC_CTX *)0x0) {
      pEVar6 = (EVP_MAC_CTX *)0x0;
    }
    else {
      iVar4 = 0x32;
      if (0x1f < uVar8) {
        iVar3 = (*cb)(local_90,local_90 + 0x10,(EVP_CIPHER_CTX *)ctx,pEVar6,0);
        if (iVar3 != 0) {
          sVar7 = EVP_MAC_CTX_get_mac_size(pEVar6);
          puVar1 = local_90;
          if (uVar8 < sVar7 + 0x20) goto LAB_0011f028;
          lVar9 = uVar8 - sVar7;
          iVar4 = EVP_MAC_update(pEVar6,local_90,lVar9);
          if ((iVar4 != 0) && (iVar4 = EVP_MAC_final(pEVar6,hmac,&hlen,0x40), iVar4 != 0)) {
            iVar4 = (*ptls_mem_equal)(puVar1 + lVar9,hmac,sVar7);
            ppVar2 = local_88;
            if (iVar4 == 0) {
              iVar4 = 0x28;
              goto LAB_0011f028;
            }
            iVar4 = ptls_buffer_reserve(local_88,lVar9 - 0x20U);
            if (iVar4 != 0) goto LAB_0011f028;
            iVar4 = EVP_DecryptUpdate(ctx,ppVar2->base + ppVar2->off,&clen,local_90 + 0x20,
                                      (int)(lVar9 - 0x20U));
            if (iVar4 != 0) {
              sVar7 = (long)clen + ppVar2->off;
              ppVar2->off = sVar7;
              iVar4 = EVP_DecryptFinal_ex(ctx,ppVar2->base + sVar7,&clen);
              if (iVar4 != 0) {
                ppVar2->off = ppVar2->off + (long)clen;
                iVar4 = 0;
                goto LAB_0011f028;
              }
            }
          }
        }
        iVar4 = 0x203;
      }
    }
  }
LAB_0011f028:
  EVP_CIPHER_CTX_free(ctx);
  if (pEVar6 != (EVP_MAC_CTX *)0x0) {
    EVP_MAC_CTX_free(pEVar6);
  }
  if (lVar5 != 0) {
    EVP_MAC_free(lVar5);
  }
  return iVar4;
}

Assistant:

int ptls_openssl_decrypt_ticket_evp(ptls_buffer_t *buf, ptls_iovec_t src,
                                    int (*cb)(unsigned char *key_name, unsigned char *iv, EVP_CIPHER_CTX *ctx, EVP_MAC_CTX *hctx,
                                              int enc))
{
    EVP_CIPHER_CTX *cctx = NULL;
    EVP_MAC *mac = NULL;
    EVP_MAC_CTX *hctx = NULL;
    size_t hlen;
    int clen, ret;

    if ((cctx = EVP_CIPHER_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((mac = EVP_MAC_fetch(NULL, "HMAC", NULL)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((hctx = EVP_MAC_CTX_new(mac)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    /* obtain cipher and hash context.
     * Note: no need to handle renew, since in picotls we always send a new ticket to minimize the chance of ticket reuse */
    if (src.len < TICKET_LABEL_SIZE + TICKET_IV_SIZE) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    if (!(*cb)(src.base, src.base + TICKET_LABEL_SIZE, cctx, hctx, 0)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }

    /* check hmac, and exclude label, iv, hmac */
    size_t hmac_size = EVP_MAC_CTX_get_mac_size(hctx);
    if (src.len < TICKET_LABEL_SIZE + TICKET_IV_SIZE + hmac_size) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    src.len -= hmac_size;
    uint8_t hmac[EVP_MAX_MD_SIZE];
    if (!EVP_MAC_update(hctx, src.base, src.len) || !EVP_MAC_final(hctx, hmac, &hlen, sizeof(hmac))) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (!ptls_mem_equal(src.base + src.len, hmac, hmac_size)) {
        ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        goto Exit;
    }
    src.base += TICKET_LABEL_SIZE + TICKET_IV_SIZE;
    src.len -= TICKET_LABEL_SIZE + TICKET_IV_SIZE;

    /* decrypt */
    if ((ret = ptls_buffer_reserve(buf, src.len)) != 0)
        goto Exit;
    if (!EVP_DecryptUpdate(cctx, buf->base + buf->off, &clen, src.base, (int)src.len)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    buf->off += clen;
    if (!EVP_DecryptFinal_ex(cctx, buf->base + buf->off, &clen)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    buf->off += clen;

    ret = 0;

Exit:
    if (cctx != NULL)
        EVP_CIPHER_CTX_free(cctx);
    if (hctx != NULL)
        EVP_MAC_CTX_free(hctx);
    if (mac != NULL)
        EVP_MAC_free(mac);
    return ret;
}